

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double *acov,int lag)

{
  size_t sVar1;
  uint uVar2;
  double *x;
  int *ipiv;
  double *A;
  double *b;
  undefined8 *__ptr;
  double *psi;
  undefined8 *__ptr_00;
  long lVar3;
  void *__src;
  double *pdVar4;
  long lVar5;
  undefined8 *puVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  uint j;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint N;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  
  lVar15 = (long)p;
  lVar14 = lVar15 + 1;
  sVar1 = lVar15 * 8 + 8;
  x = (double *)malloc(sVar1);
  ipiv = (int *)malloc(lVar15 * 4 + 4);
  A = (double *)malloc(sVar1 * lVar14);
  b = (double *)malloc(sVar1);
  __ptr = (undefined8 *)malloc(sVar1);
  sVar1 = (long)q * 8 + 8;
  psi = (double *)malloc(sVar1);
  __ptr_00 = (undefined8 *)malloc(sVar1);
  *__ptr = 0xbff0000000000000;
  *__ptr_00 = 0x3ff0000000000000;
  if (0 < p) {
    memcpy(__ptr + 1,phi,(ulong)(uint)p << 3);
  }
  N = p + 1;
  j = q + 1;
  if (0 < q) {
    memcpy(__ptr_00 + 1,theta,(ulong)(uint)q << 3);
  }
  uVar2 = j;
  if (q < p) {
    uVar2 = p;
  }
  lVar3 = (long)(int)uVar2;
  __src = malloc(lVar3 * 8);
  uVar13 = (ulong)N;
  if (-1 < p) {
    uVar12 = 0;
    pdVar4 = A;
    do {
      uVar9 = uVar12 & 0xffffffff;
      uVar10 = 0;
      do {
        dVar16 = 1.0;
        if (uVar12 != uVar10) {
          dVar16 = 0.0;
        }
        if (uVar12 == 0) {
          dVar16 = 0.0;
        }
        iVar8 = (int)uVar9;
        uVar11 = (ulong)(uint)-iVar8;
        if (0 < iVar8) {
          uVar11 = uVar9;
        }
        pdVar4[uVar10] = dVar16;
        A[uVar12 * uVar13 + uVar11] = A[uVar12 * uVar13 + uVar11] - (double)__ptr[uVar10];
        uVar10 = uVar10 + 1;
        uVar9 = (ulong)(iVar8 - 1);
      } while (uVar13 != uVar10);
      uVar12 = uVar12 + 1;
      pdVar4 = pdVar4 + uVar13;
    } while (uVar12 != uVar13);
  }
  psiweight(phi,theta,psi,p,q,j);
  if (0 < (int)uVar2) {
    lVar5 = 0;
    puVar6 = __ptr_00;
    do {
      dVar16 = 0.0;
      if (-1 < q) {
        uVar12 = 0;
        do {
          if ((long)(lVar5 + uVar12) <= (long)q) {
            dVar16 = dVar16 + (double)puVar6[uVar12] * psi[uVar12];
          }
          uVar12 = uVar12 + 1;
        } while (j != uVar12);
      }
      *(double *)((long)__src + lVar5 * 8) = dVar16 * var;
      lVar5 = lVar5 + 1;
      puVar6 = puVar6 + 1;
    } while (lVar5 != lVar3);
  }
  if (p < 0) {
    ludecomp(A,N,ipiv);
    linsolve(A,N,b,ipiv,x);
  }
  else {
    memcpy(b,__src,uVar13 * 8);
    ludecomp(A,N,ipiv);
    linsolve(A,N,b,ipiv,x);
    memcpy(acov,x,uVar13 * 8);
  }
  if ((int)N < lag) {
    pdVar4 = acov + lVar15;
    do {
      dVar16 = 0.0;
      if (0 < p) {
        lVar15 = 0;
        pdVar7 = phi;
        do {
          dVar16 = dVar16 + *pdVar7 * pdVar4[lVar15];
          lVar15 = lVar15 + -1;
          pdVar7 = pdVar7 + 1;
        } while (1 - uVar13 != lVar15);
      }
      if (lVar14 < lVar3) {
        dVar16 = dVar16 + *(double *)((long)__src + lVar14 * 8);
      }
      acov[lVar14] = dVar16;
      lVar14 = lVar14 + 1;
      pdVar4 = pdVar4 + 1;
    } while ((int)lVar14 != lag);
  }
  free(__ptr);
  free(__ptr_00);
  free(__src);
  free(psi);
  free(x);
  free(A);
  free(ipiv);
  free(b);
  return;
}

Assistant:

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double* acov, int lag) {
	int i,j,t,m;
	double *tcov,*psi,*A,*b,*ph,*th,*thph;
	int *ipiv;
	int p1;
	double temp;
	
	p1 = p+1;
	tcov = (double*) malloc(sizeof(double) * (p1));
	ipiv = (int*) malloc(sizeof(int) * (p1));
	A = (double*) malloc(sizeof(double) * (p1) * (p1));
	b = (double*) malloc(sizeof(double) * (p1));
	ph = (double*) malloc(sizeof(double) * (p1));
	psi = (double*) malloc(sizeof(double) * (q+1));
	th = (double*) malloc(sizeof(double) * (q+1));

	ph[0] = -1.0;
	th[0] = 1.0;
	
	for(i = 0; i < p;++i) {
		ph[i+1] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		th[i+1] = theta[i];
	}
	
	if (p >= q+1) {
		m = p;
	} else {
		m = q + 1;
	}
	thph = (double*) malloc(sizeof(double) * m);
	// set A
	for(i = 0; i < p1;++i) {
		for(j=0; j < p1;++j) {
			A[i*p1+j] = 0.;
			if (i == j && i != 0) {
				A[i*p1+j] = 1.;
			}

			t = i - j;
			if (t < 0) {
				t = -t;
			} 
			
			A[i*p1+t] -= ph[j];
			
		}
	}
	
	//set b
	
	psiweight(phi,theta,psi,p,q,q+1);
	for(i=0; i < m;++i) {
		
		temp = 0.;
		for(j = 0; j < q+1;++j) {
			if(i+j < q+1) {
				temp += th[i+j] * psi[j];
			}
		}
		thph[i] = temp*var;
		
	}
	
	for(i=0; i < p1;++i) {
		b[i] = thph[i];
	}
	
	ludecomp(A,p1,ipiv);
	linsolve(A,p1,b,ipiv,tcov);
	
	for(i = 0; i < p1;++i) {
		acov[i] = tcov[i];
	}
	
	for(i = p1; i < lag;++i) {
		temp = 0.0;
		for(j = 1; j < p1; ++j) {
			temp+= phi[j-1] * acov[i - j];
		}
		if (i < m) {
			temp += thph[i];
		}
		acov[i] = temp;
	}
	
	free(ph);
	free(th);
	free(thph);
	free(psi);
	free(tcov);
	free(A);
	free(ipiv);
	free(b);
}